

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm_x86.cpp
# Opt level: O2

int __thiscall
ncnn::LSTM_x86::forward_int8(LSTM_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _h;
  int iVar1;
  size_t sVar2;
  undefined4 uVar3;
  undefined1 uVar4;
  undefined1 uVar6;
  undefined1 uVar8;
  undefined1 uVar10;
  undefined4 uVar11;
  undefined1 uVar12;
  undefined1 uVar14;
  undefined1 uVar16;
  undefined1 uVar18;
  undefined4 uVar19;
  undefined1 uVar20;
  undefined1 uVar22;
  undefined1 uVar24;
  undefined1 uVar26;
  undefined8 uVar27;
  int *piVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  int iVar38;
  Mat m_3;
  Mat m_2;
  Mat m_7;
  Option opt_quant;
  Mat m_6;
  Mat m_1;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Mat local_78;
  undefined4 uVar5;
  undefined3 uVar7;
  undefined2 uVar9;
  undefined4 uVar13;
  undefined3 uVar15;
  undefined2 uVar17;
  undefined4 uVar21;
  undefined3 uVar23;
  undefined2 uVar25;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined3 uVar30;
  undefined1 uVar31;
  undefined2 uVar32;
  undefined1 uVar33;
  
  _h = bottom_blob->h;
  iVar1 = (this->super_LSTM).direction;
  local_118.cstep = 0;
  local_118.data = (void *)0x0;
  local_118.refcount._0_4_ = 0;
  local_118.refcount._4_4_ = 0;
  local_118.elemsize._0_4_ = 0;
  local_118._20_8_ = 0;
  local_118.allocator = (Allocator *)0x0;
  local_118.dims = 0;
  local_118.w = 0;
  local_118.h = 0;
  local_118.d = 0;
  local_118.c = 0;
  Mat::create(&local_118,(this->super_LSTM).num_output,4,opt->workspace_allocator);
  iVar38 = -100;
  if ((local_118.data != (void *)0x0) && (local_118.cstep * (long)local_118.c != 0)) {
    uVar35 = (int)local_118.cstep * local_118.c;
    uVar37 = 0;
    uVar36 = (ulong)uVar35;
    if ((int)uVar35 < 1) {
      uVar36 = uVar37;
    }
    for (; (int)uVar36 != (int)uVar37; uVar37 = uVar37 + 1) {
      *(undefined4 *)((long)local_118.data + uVar37 * 4) = 0;
    }
    local_168.cstep = 0;
    local_168.data = (void *)0x0;
    local_168.refcount._0_4_ = 0;
    local_168.refcount._4_4_ = 0;
    local_168.elemsize._0_4_ = 0;
    local_168._20_8_ = 0;
    local_168.allocator = (Allocator *)0x0;
    local_168.dims = 0;
    local_168.w = 0;
    local_168.h = 0;
    local_168.d = 0;
    local_168.c = 0;
    Mat::create(&local_168,(this->super_LSTM).hidden_size,4,opt->workspace_allocator);
    iVar38 = -100;
    if ((local_168.data != (void *)0x0) && (local_168.cstep * (long)local_168.c != 0)) {
      uVar35 = (int)local_168.cstep * local_168.c;
      uVar37 = 0;
      uVar36 = (ulong)uVar35;
      if ((int)uVar35 < 1) {
        uVar36 = uVar37;
      }
      for (; (int)uVar36 != (int)uVar37; uVar37 = uVar37 + 1) {
        *(undefined4 *)((long)local_168.data + uVar37 * 4) = 0;
      }
      Mat::create(top_blob,(this->super_LSTM).num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
      if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
        local_78.cstep = 0;
        local_78.data = (void *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78._20_8_ = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        local_c8.cstep = 0;
        local_c8.data = (void *)0x0;
        local_c8.refcount._0_4_ = 0;
        local_c8.refcount._4_4_ = 0;
        local_c8.elemsize._0_4_ = 0;
        local_c8._20_8_ = 0;
        local_c8.allocator = (Allocator *)0x0;
        local_c8.dims = 0;
        local_c8.w = 0;
        local_c8.h = 0;
        local_c8.d = 0;
        local_c8.c = 0;
        opt_quant.lightmode = opt->lightmode;
        opt_quant.use_shader_pack8 = opt->use_shader_pack8;
        opt_quant.use_subgroup_ops = opt->use_subgroup_ops;
        opt_quant.use_reserved_0 = opt->use_reserved_0;
        opt_quant.num_threads = opt->num_threads;
        uVar3 = opt->openmp_blocktime;
        uVar4 = opt->use_winograd_convolution;
        uVar6 = opt->use_sgemm_convolution;
        uVar8 = opt->use_int8_inference;
        uVar10 = opt->use_vulkan_compute;
        uVar9 = CONCAT11(uVar10,uVar8);
        uVar7 = CONCAT21(uVar9,uVar6);
        uVar5 = CONCAT31(uVar7,uVar4);
        uVar36._0_1_ = opt->use_bf16_storage;
        uVar36._1_1_ = opt->use_fp16_packed;
        uVar36._2_1_ = opt->use_fp16_storage;
        uVar36._3_1_ = opt->use_fp16_arithmetic;
        uVar36._4_1_ = opt->use_int8_packed;
        uVar36._5_1_ = opt->use_int8_storage;
        uVar36._6_1_ = opt->use_int8_arithmetic;
        uVar36._7_1_ = opt->use_packing_layout;
        uVar11 = opt->vulkan_device_index;
        uVar12 = opt->use_reserved_1;
        uVar14 = opt->use_image_storage;
        uVar16 = opt->use_tensor_storage;
        uVar18 = opt->use_reserved_2;
        uVar17 = CONCAT11(uVar18,uVar16);
        uVar15 = CONCAT21(uVar17,uVar14);
        uVar13 = CONCAT31(uVar15,uVar12);
        uVar19 = opt->flush_denormals;
        uVar20 = opt->use_local_pool_allocator;
        uVar22 = opt->use_shader_local_memory;
        uVar24 = opt->use_cooperative_matrix;
        uVar26 = opt->use_winograd23_convolution;
        uVar25 = CONCAT11(uVar26,uVar24);
        uVar23 = CONCAT21(uVar25,uVar22);
        uVar21 = CONCAT31(uVar23,uVar20);
        uVar27._0_1_ = opt->use_winograd43_convolution;
        uVar27._1_1_ = opt->use_winograd63_convolution;
        uVar27._2_1_ = opt->use_a53_a55_optimized_kernel;
        uVar27._3_1_ = opt->use_fp16_uniform;
        uVar28 = opt->use_int8_uniform;
        uVar29 = opt->use_reserved_9;
        uVar31 = opt->use_reserved_10;
        uVar33 = opt->use_reserved_11;
        uVar32 = CONCAT11(uVar33,uVar31);
        uVar30 = CONCAT21(uVar32,uVar29);
        uVar27._4_4_ = CONCAT31(uVar30,uVar28);
        opt_quant._56_4_ = SUB84(uVar27,0);
        opt_quant.workspace_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_quant.workspace_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_quant.blob_allocator._0_4_ = SUB84(opt->workspace_allocator,0);
        opt_quant.blob_allocator._4_4_ = (undefined4)((ulong)opt->workspace_allocator >> 0x20);
        opt_quant._32_8_ = uVar36 & 0xffffffffffffff;
        opt_quant.openmp_blocktime = uVar3;
        opt_quant._28_4_ = uVar5;
        opt_quant.vulkan_device_index = uVar11;
        opt_quant._44_4_ = uVar13;
        opt_quant.flush_denormals = uVar19;
        opt_quant._52_4_ = uVar21;
        opt_quant._60_4_ = uVar27._4_4_;
        lstm_dynamic_quantize(bottom_blob,&local_78,&local_c8,&opt_quant);
        uVar35 = (this->super_LSTM).direction;
        if (uVar35 < 2) {
          opt_quant._44_4_ = (this->weight_data_tm).w;
          opt_quant.flush_denormals = (this->weight_data_tm).h;
          opt_quant._56_4_ = (this->weight_data_tm).d;
          opt_quant._0_8_ = (this->weight_data_tm).data;
          sVar2 = (this->weight_data_tm).elemsize;
          opt_quant.openmp_blocktime = (this->weight_data_tm).elempack;
          opt_quant._32_8_ = (this->weight_data_tm).allocator;
          opt_quant.blob_allocator._0_4_ = 0;
          opt_quant.blob_allocator._4_4_ = 0;
          opt_quant.workspace_allocator._0_4_ = (undefined4)sVar2;
          opt_quant.workspace_allocator._4_4_ = (undefined4)(sVar2 >> 0x20);
          opt_quant.use_local_pool_allocator = true;
          opt_quant.use_shader_local_memory = false;
          opt_quant.use_cooperative_matrix = false;
          opt_quant.use_winograd23_convolution = false;
          opt_quant.vulkan_device_index = (this->weight_data_tm).dims + -1;
          m_1.w = (this->weight_data_tm_int8_descales).w;
          m_1.h = (this->weight_data_tm_int8_descales).h;
          m_1.data = (this->weight_data_tm_int8_descales).data;
          uVar36 = (this->weight_data_tm_int8_descales).elemsize;
          m_1.elempack = (this->weight_data_tm_int8_descales).elempack;
          m_1.allocator = (this->weight_data_tm_int8_descales).allocator;
          m_1.refcount._0_4_ = 0;
          m_1.refcount._4_4_ = 0;
          m_1.elemsize._0_4_ = (undefined4)uVar36;
          m_1.elemsize._4_4_ = (undefined4)(uVar36 >> 0x20);
          m_1.c = (this->weight_data_tm_int8_descales).d;
          m_1.d = 1;
          iVar1 = (this->weight_data_tm_int8_descales).dims;
          m_1.dims = iVar1 + -1;
          m_1.cstep = (uVar36 * (long)m_1.h * (long)m_1.w + 0xf & 0xfffffffffffffff0) / uVar36;
          if (iVar1 == 4) {
            m_1.cstep = (long)m_1.h * (long)m_1.w;
          }
          m_2.w = (this->bias_c_data_packed).w;
          m_2.h = (this->bias_c_data_packed).h;
          m_2.c = (this->bias_c_data_packed).d;
          m_2.data = (this->bias_c_data_packed).data;
          m_2.elemsize = (this->bias_c_data_packed).elemsize;
          m_2.elempack = (this->bias_c_data_packed).elempack;
          m_2.allocator = (this->bias_c_data_packed).allocator;
          m_2.refcount = (int *)0x0;
          m_2.d = 1;
          iVar1 = (this->bias_c_data_packed).dims;
          m_2.dims = iVar1 + -1;
          m_2.cstep = (m_2.elemsize * (long)m_2.h * (long)m_2.w + 0xf & 0xfffffffffffffff0) /
                      m_2.elemsize;
          if (iVar1 == 4) {
            m_2.cstep = (long)m_2.h * (long)m_2.w;
          }
          if ((this->super_LSTM).num_output == (this->super_LSTM).hidden_size) {
            m_3.cstep = 0;
            m_3.data = (void *)0x0;
            m_3.elemsize._0_4_ = 0;
            m_3.elemsize._4_4_ = 0;
            m_3.elempack = 0;
            m_3.allocator = (Allocator *)0x0;
            m_3.dims = 0;
            m_3.w = 0;
            m_3.h = 0;
            m_3.d = 0;
            m_3.c = 0;
          }
          else {
            m_3.w = (this->super_LSTM).weight_hr_data.w;
            m_3.h = (this->super_LSTM).weight_hr_data.h;
            m_3.data = (this->super_LSTM).weight_hr_data.data;
            uVar36 = (this->super_LSTM).weight_hr_data.elemsize;
            m_3.elempack = (this->super_LSTM).weight_hr_data.elempack;
            m_3.allocator = (this->super_LSTM).weight_hr_data.allocator;
            m_3.elemsize._0_4_ = (undefined4)uVar36;
            m_3.elemsize._4_4_ = (undefined4)(uVar36 >> 0x20);
            m_3.c = (this->super_LSTM).weight_hr_data.d;
            m_3.d = 1;
            iVar1 = (this->super_LSTM).weight_hr_data.dims;
            m_3.dims = iVar1 + -1;
            m_3.cstep = (uVar36 * (long)m_3.h * (long)m_3.w + 0xf & 0xfffffffffffffff0) / uVar36;
            if (iVar1 == 4) {
              m_3.cstep = (long)m_3.h * (long)m_3.w;
            }
          }
          m_3.refcount._4_4_ = 0;
          m_3.refcount._0_4_ = 0;
          lstm_int8(&local_78,&local_c8,top_blob,uVar35,(Mat *)&opt_quant,&m_1,&m_2,&m_3,&local_118,
                    &local_168,opt);
          piVar34 = (int *)CONCAT44(m_3.refcount._4_4_,m_3.refcount._0_4_);
          if (piVar34 != (int *)0x0) {
            LOCK();
            *piVar34 = *piVar34 + -1;
            UNLOCK();
            if (*piVar34 == 0) {
              if (m_3.allocator == (Allocator *)0x0) {
                free(m_3.data);
              }
              else {
                (*(m_3.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          if (m_2.refcount != (int *)0x0) {
            LOCK();
            *m_2.refcount = *m_2.refcount + -1;
            UNLOCK();
            if (*m_2.refcount == 0) {
              if (m_2.allocator == (Allocator *)0x0) {
                free(m_2.data);
              }
              else {
                (*(m_2.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar34 = (int *)CONCAT44(m_1.refcount._4_4_,m_1.refcount._0_4_);
          if (piVar34 != (int *)0x0) {
            LOCK();
            *piVar34 = *piVar34 + -1;
            UNLOCK();
            if (*piVar34 == 0) {
              if (m_1.allocator == (Allocator *)0x0) {
                free(m_1.data);
              }
              else {
                (*(m_1.allocator)->_vptr_Allocator[3])();
              }
            }
          }
          piVar34 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
          if (piVar34 != (int *)0x0) {
            LOCK();
            *piVar34 = *piVar34 + -1;
            UNLOCK();
            if (*piVar34 == 0) {
              if (opt_quant._32_8_ == 0) {
                free((void *)opt_quant._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_quant._32_8_ + 0x18))();
              }
            }
          }
          uVar35 = (this->super_LSTM).direction;
        }
        if (uVar35 == 2) {
          opt_quant.lightmode = false;
          opt_quant.use_shader_pack8 = false;
          opt_quant.use_subgroup_ops = false;
          opt_quant.use_reserved_0 = false;
          opt_quant.num_threads = 0;
          opt_quant.blob_allocator._0_4_ = 0;
          opt_quant.blob_allocator._4_4_ = 0;
          opt_quant.workspace_allocator._0_4_ = 0;
          opt_quant.workspace_allocator._4_4_ = 0;
          opt_quant.openmp_blocktime = 0;
          opt_quant.use_bf16_storage = false;
          opt_quant.use_fp16_packed = false;
          opt_quant.use_fp16_storage = false;
          opt_quant.use_fp16_arithmetic = false;
          opt_quant.use_int8_packed = false;
          opt_quant.use_int8_storage = false;
          opt_quant.use_int8_arithmetic = false;
          opt_quant.use_packing_layout = false;
          opt_quant.vulkan_device_index = 0;
          opt_quant.use_reserved_1 = false;
          opt_quant.use_image_storage = false;
          opt_quant.use_tensor_storage = false;
          opt_quant.use_reserved_2 = false;
          opt_quant.flush_denormals = 0;
          opt_quant.use_local_pool_allocator = false;
          opt_quant.use_shader_local_memory = false;
          opt_quant.use_cooperative_matrix = false;
          opt_quant.use_winograd23_convolution = false;
          opt_quant.use_winograd43_convolution = false;
          opt_quant.use_winograd63_convolution = false;
          opt_quant.use_a53_a55_optimized_kernel = false;
          opt_quant.use_fp16_uniform = false;
          Mat::create((Mat *)&opt_quant,(this->super_LSTM).num_output,_h,4,opt->workspace_allocator)
          ;
          piVar34 = (int *)CONCAT44(opt_quant.blob_allocator._4_4_,opt_quant.blob_allocator._0_4_);
          if (piVar34 != (int *)0x0) {
            LOCK();
            *piVar34 = *piVar34 + -1;
            UNLOCK();
            if (*piVar34 == 0) {
              if (opt_quant._32_8_ == 0) {
                free((void *)opt_quant._0_8_);
              }
              else {
                (**(code **)(*(long *)opt_quant._32_8_ + 0x18))();
              }
            }
          }
          iVar38 = -100;
        }
        else {
          iVar38 = 0;
        }
        piVar34 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
        if (piVar34 != (int *)0x0) {
          LOCK();
          *piVar34 = *piVar34 + -1;
          UNLOCK();
          if (*piVar34 == 0) {
            if (local_c8.allocator == (Allocator *)0x0) {
              free(local_c8.data);
            }
            else {
              (*(local_c8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar34 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
        if (piVar34 != (int *)0x0) {
          LOCK();
          *piVar34 = *piVar34 + -1;
          UNLOCK();
          if (*piVar34 == 0) {
            if (local_78.allocator == (Allocator *)0x0) {
              free(local_78.data);
            }
            else {
              (*(local_78.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
    piVar34 = (int *)CONCAT44(local_168.refcount._4_4_,local_168.refcount._0_4_);
    if (piVar34 != (int *)0x0) {
      LOCK();
      *piVar34 = *piVar34 + -1;
      UNLOCK();
      if (*piVar34 == 0) {
        if (local_168.allocator == (Allocator *)0x0) {
          free(local_168.data);
        }
        else {
          (*(local_168.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar34 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
  if (piVar34 != (int *)0x0) {
    LOCK();
    *piVar34 = *piVar34 + -1;
    UNLOCK();
    if (*piVar34 == 0) {
      if (local_118.allocator == (Allocator *)0x0) {
        free(local_118.data);
      }
      else {
        (*(local_118.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar38;
}

Assistant:

int LSTM_x86::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int T = bottom_blob.h;

    int num_directions = direction == 2 ? 2 : 1;

    // initial hidden state
    Mat hidden(num_output, 4u, opt.workspace_allocator);
    if (hidden.empty())
        return -100;
    hidden.fill(0.f);

    Mat cell(hidden_size, 4u, opt.workspace_allocator);
    if (cell.empty())
        return -100;
    cell.fill(0.f);

    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // dynamic quantize bottom_blob
    Mat bottom_blob_int8;
    Mat bottom_blob_int8_descales;
    {
        Option opt_quant = opt;
        opt_quant.blob_allocator = opt.workspace_allocator;
        opt_quant.use_packing_layout = false;
        lstm_dynamic_quantize(bottom_blob, bottom_blob_int8, bottom_blob_int8_descales, opt_quant);
    }

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob, direction, weight_data_tm.channel(0), weight_data_tm_int8_descales.channel(0), bias_c_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        {
            lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob_forward, 0, weight_data_tm.channel(0), weight_data_tm_int8_descales.channel(0), bias_c_data_packed.channel(0), num_output == hidden_size ? Mat() : weight_hr_data.channel(0), hidden, cell, opt);
        }

        hidden.fill(0.f);
        cell.fill(0.0f);

        {
            lstm_int8(bottom_blob_int8, bottom_blob_int8_descales, top_blob_reverse, 1, weight_data_tm.channel(1), weight_data_tm_int8_descales.channel(1), bias_c_data_packed.channel(1), num_output == hidden_size ? Mat() : weight_hr_data.channel(1), hidden, cell, opt);
        }

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    return 0;
}